

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfd_elements_transaction.cpp
# Opt level: O3

void __thiscall
cfd::ConfidentialTransactionController::InsertUnlockingScript
          (ConfidentialTransactionController *this,Txid *txid,uint32_t vout,
          vector<cfd::core::ByteData,_std::allocator<cfd::core::ByteData>_> *unlocking_scripts)

{
  ByteData *pBVar1;
  bool bVar2;
  uint32_t index;
  ConfidentialTransaction *this_00;
  ScriptElement *element;
  ByteData *data;
  ScriptBuilder builder;
  Script script;
  ScriptBuilder local_1e8;
  Script local_1c8;
  ConfidentialTxInReference local_190;
  
  this_00 = &this->transaction_;
  index = core::ConfidentialTransaction::GetTxInIndex(this_00,txid,vout);
  core::ConfidentialTransaction::GetTxIn(&local_190,this_00,index);
  core::Script::Script(&local_1c8,&local_190.super_AbstractTxInReference.unlocking_script_);
  core::ConfidentialTxInReference::~ConfidentialTxInReference(&local_190);
  bVar2 = core::Script::IsEmpty(&local_1c8);
  if (bVar2) {
    core::ConfidentialTransaction::SetUnlockingScript(this_00,index,unlocking_scripts);
  }
  else {
    local_1e8._vptr_ScriptBuilder = (_func_int **)&PTR__ScriptBuilder_007219a8;
    local_1e8.script_byte_array_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
    _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    local_1e8.script_byte_array_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
    _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    local_1e8.script_byte_array_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
    _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    core::Script::GetElementList
              ((vector<cfd::core::ScriptElement,_std::allocator<cfd::core::ScriptElement>_> *)
               &local_190,&local_1c8);
    for (; local_190.super_AbstractTxInReference._vptr_AbstractTxInReference !=
           local_190.super_AbstractTxInReference.txid_._vptr_Txid;
        local_190.super_AbstractTxInReference._vptr_AbstractTxInReference =
             (_func_int **)
             ((long)local_190.super_AbstractTxInReference._vptr_AbstractTxInReference + 0x60)) {
      core::ScriptBuilder::AppendElement
                (&local_1e8,
                 (ScriptElement *)local_190.super_AbstractTxInReference._vptr_AbstractTxInReference)
      ;
    }
    std::vector<cfd::core::ScriptElement,_std::allocator<cfd::core::ScriptElement>_>::~vector
              ((vector<cfd::core::ScriptElement,_std::allocator<cfd::core::ScriptElement>_> *)
               &local_190);
    pBVar1 = (unlocking_scripts->
             super__Vector_base<cfd::core::ByteData,_std::allocator<cfd::core::ByteData>_>)._M_impl.
             super__Vector_impl_data._M_finish;
    for (data = (unlocking_scripts->
                super__Vector_base<cfd::core::ByteData,_std::allocator<cfd::core::ByteData>_>).
                _M_impl.super__Vector_impl_data._M_start; data != pBVar1; data = data + 1) {
      core::ScriptBuilder::AppendData(&local_1e8,data);
    }
    core::ScriptBuilder::Build((Script *)&local_190,&local_1e8);
    core::ConfidentialTransaction::SetUnlockingScript(this_00,index,(Script *)&local_190);
    core::Script::~Script((Script *)&local_190);
    local_1e8._vptr_ScriptBuilder = (_func_int **)&PTR__ScriptBuilder_007219a8;
    if (local_1e8.script_byte_array_.
        super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
        super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(local_1e8.script_byte_array_.
                      super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                      super__Vector_impl_data._M_start);
    }
  }
  core::Script::~Script(&local_1c8);
  return;
}

Assistant:

void ConfidentialTransactionController::InsertUnlockingScript(
    const Txid& txid, uint32_t vout,
    const std::vector<ByteData>& unlocking_scripts) {
  uint32_t txin_index = transaction_.GetTxInIndex(txid, vout);
  Script script = transaction_.GetTxIn(txin_index).GetUnlockingScript();
  if (script.IsEmpty()) {
    transaction_.SetUnlockingScript(txin_index, unlocking_scripts);
  } else {
    ScriptBuilder builder;
    for (const auto& element : script.GetElementList()) {
      builder.AppendElement(element);
    }
    for (const ByteData& data : unlocking_scripts) {
      builder.AppendData(data);
    }
    transaction_.SetUnlockingScript(txin_index, builder.Build());
  }
}